

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_aspect.c
# Opt level: O0

int log_aspect_attach(log_aspect aspect,log_policy policy)

{
  int iVar1;
  log_policy *pplVar2;
  log_policy in_RSI;
  log_aspect in_RDI;
  size_t size;
  void *data;
  size_t local_28;
  
  if ((in_RDI->restrict_cb != (log_aspect_restrict_cb)0x0) &&
     (iVar1 = (*in_RDI->restrict_cb)(in_RDI,in_RSI), iVar1 != 0)) {
    return 1;
  }
  if (in_RDI->size <= in_RDI->count + 1) {
    if (0xff < in_RDI->size) {
      return 1;
    }
    local_28 = in_RDI->size * 2;
    if (0xff < local_28 - 1) {
      local_28 = 0x100;
    }
    pplVar2 = (log_policy *)realloc(in_RDI->policies,local_28 << 3);
    if (pplVar2 == (log_policy *)0x0) {
      return 1;
    }
    in_RDI->policies = pplVar2;
    in_RDI->size = local_28;
  }
  log_policy_classify(in_RSI,in_RDI);
  in_RDI->policies[in_RDI->count] = in_RSI;
  in_RDI->count = in_RDI->count + 1;
  return 0;
}

Assistant:

int log_aspect_attach(log_aspect aspect, log_policy policy)
{
	if (aspect->restrict_cb != NULL && aspect->restrict_cb(aspect, policy) != 0)
	{
		return 1;
	}

	if ((aspect->count + 1) >= aspect->size)
	{
		register void *data;

		size_t size = 0;

		if (aspect->size >= LOG_ASPECT_POLICIES_MAX_SIZE)
		{
			return 1;
		}

		size = aspect->size << 0x01;

		if ((size - 1) >= LOG_ASPECT_POLICIES_MAX_SIZE)
		{
			size = LOG_ASPECT_POLICIES_MAX_SIZE;
		}

		data = realloc(aspect->policies, sizeof(log_policy) * size);

		if (data == NULL)
		{
			return 1;
		}

		aspect->policies = data;

		aspect->size = size;
	}

	log_policy_classify(policy, aspect);

	aspect->policies[aspect->count] = policy;

	++aspect->count;

	return 0;
}